

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UTApprovals.h
# Opt level: O0

void __thiscall ApprovalTests::cfg::reporter::on(reporter *this,test_end test_end)

{
  test_end tVar1;
  bool bVar2;
  reporter<boost::ext::ut::v1_1_8::printer> *in_RDI;
  undefined8 uStack0000000000000010;
  undefined8 uStack0000000000000018;
  undefined8 uStack0000000000000020;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  reporter<boost::ext::ut::v1_1_8::printer> *prVar3;
  
  prVar3 = in_RDI;
  while( true ) {
    bVar2 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(in_stack_ffffffffffffffc0);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x115537);
  }
  tVar1.name.size_ = (unsigned_long)prVar3;
  tVar1.type.data_ = (char *)uStack0000000000000010;
  tVar1.type.size_ = uStack0000000000000018;
  tVar1.name.data_ = (char *)uStack0000000000000020;
  boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>::on(in_RDI,tVar1);
  return;
}

Assistant:

auto on(boost::ut::events::test_end test_end) -> void
            {
                while (!currentTest.sections.empty())
                {
                    currentTest.sections.pop_back();
                }
                boost::ut::reporter<boost::ut::printer>::on(test_end);
            }